

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O3

BOOL MoveFileExA(LPCSTR lpExistingFileName,LPCSTR lpNewFileName,DWORD dwFlags)

{
  SIZE_T *_Dst;
  long lVar1;
  undefined8 lpPath;
  int iVar2;
  BOOL BVar3;
  BOOL BVar4;
  DWORD DVar5;
  void *pvVar6;
  size_t sVar7;
  DWORD *pDVar8;
  int *piVar9;
  ulong count;
  long in_FS_OFFSET;
  undefined1 local_168 [8];
  stat buf;
  DWORD local_bc;
  undefined1 local_b8 [4];
  DWORD dwLastError;
  PathCharString destPS;
  PathCharString sourcePS;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _Dst = &destPS.m_count;
  destPS._32_8_ = local_b8;
  destPS.m_size = 0;
  local_bc = 0;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_00329b86;
  pvVar6 = pthread_getspecific(CorUnix::thObjKey);
  if (pvVar6 == (void *)0x0) {
    CreateCurrentThreadData();
  }
  if (3 < dwFlags) {
    fprintf(_stderr,"] %s %s:%d","MoveFileExA",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
            ,0x586);
    fprintf(_stderr,"dwFlags is invalid\n");
    local_bc = 0x57;
    DVar5 = 0x57;
    goto LAB_00329996;
  }
  sVar7 = strlen(lpExistingFileName);
  StackString<32UL,_char>::Resize((StackString<32UL,_char> *)&destPS.m_count,(long)(int)sVar7);
  if (_Dst == (SIZE_T *)0x0) {
LAB_00329987:
    local_bc = 8;
    DVar5 = 8;
LAB_00329996:
    pDVar8 = (DWORD *)__errno_location();
    *pDVar8 = DVar5;
    BVar3 = 0;
  }
  else {
    strcpy_s((char *)_Dst,(size_t)sourcePS.m_buffer,lpExistingFileName);
    destPS.m_count._0_1_ = 0;
    FILEDosToUnixPathA((LPSTR)_Dst);
    sVar7 = strlen(lpNewFileName);
    count = (ulong)(int)sVar7;
    StackString<32UL,_char>::Resize((StackString<32UL,_char> *)local_b8,count);
    lpPath = destPS._32_8_;
    if (destPS._32_8_ == 0) goto LAB_00329987;
    strcpy_s((char *)destPS._32_8_,(size_t)destPS.m_buffer,lpNewFileName);
    if (count < destPS.m_size) {
      destPS.m_size = count;
    }
    *(undefined1 *)(destPS._32_8_ + destPS.m_size) = 0;
    FILEDosToUnixPathA((LPSTR)lpPath);
    if ((dwFlags & 1) == 0) {
      iVar2 = strcasecmp((char *)_Dst,(char *)lpPath);
      if ((iVar2 != 0) && (iVar2 = access((char *)lpPath,0), iVar2 == 0)) {
        local_bc = 0xb7;
        DVar5 = 0xb7;
        goto LAB_00329996;
      }
      iVar2 = rename((char *)_Dst,(char *)lpPath);
LAB_00329a10:
      BVar3 = 1;
      if (-1 < iVar2) goto LAB_003299a0;
      DVar5 = 0;
      piVar9 = __errno_location();
LAB_00329aa6:
      iVar2 = *piVar9;
LAB_00329aa8:
      if (iVar2 == 2) {
        iVar2 = lstat64((char *)_Dst,(stat64 *)local_168);
        if (iVar2 == -1) {
          FILEGetProperNotFoundError((LPSTR)_Dst,&local_bc);
          DVar5 = local_bc;
        }
        else {
          local_bc = 3;
          DVar5 = 3;
        }
LAB_00329bb2:
        if (DVar5 == 0) goto LAB_003299a0;
      }
      else {
        if (iVar2 != 0x16) {
          if (iVar2 == 0x12) {
            if (dwFlags < 2) {
              local_bc = 5;
              DVar5 = 5;
              goto LAB_00329996;
            }
            BVar3 = CopyFileA(lpExistingFileName,lpNewFileName,dwFlags & 1 ^ 1);
            if (BVar3 == 0) {
              local_bc = GetLastError();
              BVar3 = 0;
              DVar5 = local_bc;
            }
            else {
              BVar4 = DeleteFileA(lpExistingFileName);
              BVar3 = 1;
              if (BVar4 == 0) {
                if (PAL_InitializeChakraCoreCalled == false) goto LAB_00329b86;
                DVar5 = GetLastError();
                local_bc = DVar5;
                BVar4 = DeleteFileA(lpNewFileName);
                if ((BVar4 == 0) && (PAL_InitializeChakraCoreCalled == false)) goto LAB_00329b86;
              }
            }
          }
          else {
            local_bc = FILEGetLastErrorFromErrno();
            DVar5 = local_bc;
          }
          goto LAB_00329bb2;
        }
        local_bc = 0x20;
        DVar5 = 0x20;
      }
      goto LAB_00329996;
    }
    iVar2 = rename((char *)_Dst,(char *)lpPath);
    if (-1 < iVar2 || (dwFlags & 1) == 0) goto LAB_00329a10;
    piVar9 = __errno_location();
    iVar2 = *piVar9;
    if ((iVar2 != 0x14) && (iVar2 != 0x11)) {
      BVar3 = 1;
      DVar5 = 0;
      goto LAB_00329aa8;
    }
    BVar3 = DeleteFileA(lpNewFileName);
    if (BVar3 == 0) {
      DVar5 = GetLastError();
      BVar3 = 0;
      local_bc = DVar5;
      goto LAB_00329aa6;
    }
    buf.__glibc_reserved[2] = (__syscall_slong_t)piVar9;
    iVar2 = rename((char *)_Dst,(char *)lpPath);
    BVar3 = 1;
    if (iVar2 < 0) {
      DVar5 = 0;
      piVar9 = (int *)buf.__glibc_reserved[2];
      goto LAB_00329aa6;
    }
  }
LAB_003299a0:
  if (PAL_InitializeChakraCoreCalled != false) {
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)local_b8);
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)&destPS.m_count);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return BVar3;
    }
    __stack_chk_fail();
  }
LAB_00329b86:
  abort();
}

Assistant:

BOOL
PALAPI
MoveFileExA(
        IN LPCSTR lpExistingFileName,
        IN LPCSTR lpNewFileName,
        IN DWORD dwFlags)
{
    CPalThread *pThread;
    int   result;
    int length = 0;
    PathCharString sourcePS;
    PathCharString destPS;
    char * source;
    char * dest;
    BOOL  bRet = TRUE;
    DWORD dwLastError = 0;

    PERF_ENTRY(MoveFileExA);
    ENTRY("MoveFileExA(lpExistingFileName=%p (%S), lpNewFileName=%p (%S), "
          "dwFlags=%#x)\n",
          lpExistingFileName?lpExistingFileName:"NULL",
          lpExistingFileName?lpExistingFileName:"NULL",
          lpNewFileName?lpNewFileName:"NULL",
          lpNewFileName?lpNewFileName:"NULL", dwFlags);

    pThread = InternalGetCurrentThread();
    /* only two flags are accepted */
    if ( dwFlags & ~(MOVEFILE_COPY_ALLOWED | MOVEFILE_REPLACE_EXISTING) )
    {
        ASSERT( "dwFlags is invalid\n" );
        dwLastError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    length = strlen(lpExistingFileName);
    
    source = sourcePS.OpenStringBuffer(length);
    if (NULL == source)
    {
        dwLastError = ERROR_NOT_ENOUGH_MEMORY;
        goto done;
    }
    strcpy_s( source, sourcePS.GetSizeOf(), lpExistingFileName);
    sourcePS.CloseBuffer(length);
    
    FILEDosToUnixPathA( source );

    length = strlen(lpNewFileName);
    
    dest = destPS.OpenStringBuffer(length);
    if (NULL == dest)
    {
        dwLastError = ERROR_NOT_ENOUGH_MEMORY;
        goto done;
    }
    strcpy_s( dest, destPS.GetSizeOf(), lpNewFileName);
    destPS.CloseBuffer(length);
    
    FILEDosToUnixPathA( dest );

    if ( !(dwFlags & MOVEFILE_REPLACE_EXISTING) )
    {
#if HAVE_CASE_SENSITIVE_FILESYSTEM
        if ( strcmp(source, dest) != 0 )
#else   // HAVE_CASE_SENSITIVE_FILESYSTEM
        if ( strcasecmp(source, dest) != 0 )
#endif  // HAVE_CASE_SENSITIVE_FILESYSTEM
        {
            // Let things proceed normally if source and
            // dest are the same.
            if ( access(dest, F_OK) == 0 )
            {
                dwLastError = ERROR_ALREADY_EXISTS;
                goto done;
            }
        }
    }

    result = rename( source, dest );
    if ((result < 0) && (dwFlags & MOVEFILE_REPLACE_EXISTING) &&
        ((errno == ENOTDIR) || (errno == EEXIST)))
    {
        bRet = DeleteFileA( lpNewFileName );
        
        if ( bRet ) 
        {
            result = rename( source, dest );
        }
        else
        { 
            dwLastError = GetLastError();
        }
    } 

    if ( result < 0 )
    {
        switch( errno )
        {
        case EXDEV: /* we tried to link across devices */
        
            if ( dwFlags & MOVEFILE_COPY_ALLOWED )
            {
                BOOL bFailIfExists = !(dwFlags & MOVEFILE_REPLACE_EXISTING);
            
                /* if CopyFile fails here, so should MoveFailEx */
                bRet = CopyFileA( lpExistingFileName,
                          lpNewFileName,
                          bFailIfExists );
                /* CopyFile should set the appropriate error */
                if ( !bRet ) 
                {
                    dwLastError = GetLastError();
                }
                else
                {
                    if (!DeleteFileA(lpExistingFileName))
                    {
                        ERROR("Failed to delete the source file\n");
                        dwLastError = GetLastError();
                    
                        /* Delete the destination file if we're unable to delete 
                           the source file */
                        if (!DeleteFileA(lpNewFileName))
                        {
                            ERROR("Failed to delete the destination file\n");
                        }
                    }
                }
            }
            else
            {
                dwLastError = ERROR_ACCESS_DENIED;
            }
            break;
        case EINVAL: // tried to rename "." or ".."
            dwLastError = ERROR_SHARING_VIOLATION;
            break;
        case ENOENT:
            {
                struct stat buf;
                if (lstat(source, &buf) == -1)
                {
                    FILEGetProperNotFoundError(source, &dwLastError);
                }
                else
                {
                    dwLastError = ERROR_PATH_NOT_FOUND;
                }
            }
            break;
        default:
            dwLastError = FILEGetLastErrorFromErrno();
            break;
        }
    }

done:
    if ( dwLastError )
    {
        pThread->SetLastError( dwLastError );
        bRet = FALSE;
    }

    LOGEXIT( "MoveFileExA returns BOOL %d\n", bRet );
    PERF_EXIT(MoveFileExA);
    return bRet;
}